

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

longlong __thiscall Net::makeroom(Net *this,int x,int y,string *pass)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *__nptr;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  istream *piVar7;
  long lVar8;
  int *piVar9;
  undefined8 uVar10;
  uint uVar11;
  pointer pbVar12;
  ulong *puVar13;
  long *plVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  longlong lVar18;
  string temp;
  string reply;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  replys;
  string __str_1;
  string request;
  string __str;
  stringstream stream;
  undefined8 local_2a0;
  value_type local_298;
  string local_278;
  undefined1 local_258 [24];
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  char *local_1f8 [2];
  char local_1e8 [16];
  string local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  uVar16 = -x;
  if (0 < x) {
    uVar16 = x;
  }
  uVar17 = 1;
  if (9 < uVar16) {
    uVar15 = (ulong)uVar16;
    uVar4 = 4;
    do {
      uVar17 = uVar4;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001087c2;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001087c2;
      }
      if (uVar11 < 10000) goto LAB_001087c2;
      uVar15 = uVar15 / 10000;
      uVar4 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_001087c2:
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct((ulong)local_1f8,(char)uVar17 - (char)(x >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_1f8[0] + ((uint)x >> 0x1f),uVar17,uVar16);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x10b74d);
  local_258._0_8_ = local_258 + 0x10;
  pbVar12 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar12) {
    local_258._16_8_ = (pbVar12->_M_dataplus)._M_p;
    lStack_240 = plVar5[3];
  }
  else {
    local_258._16_8_ = (pbVar12->_M_dataplus)._M_p;
    local_258._0_8_ = (pointer)*plVar5;
  }
  local_258._8_8_ = plVar5[1];
  *plVar5 = (long)pbVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_258);
  paVar1 = &local_298.field_2;
  puVar13 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_298.field_2._M_allocated_capacity = *puVar13;
    local_298.field_2._8_8_ = plVar5[3];
    local_298._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_298.field_2._M_allocated_capacity = *puVar13;
    local_298._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_298._M_string_length = plVar5[1];
  *plVar5 = (long)puVar13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar16 = -y;
  if (0 < y) {
    uVar16 = y;
  }
  uVar17 = 1;
  if (9 < uVar16) {
    uVar15 = (ulong)uVar16;
    uVar4 = 4;
    do {
      uVar17 = uVar4;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_00108911;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_00108911;
      }
      if (uVar11 < 10000) goto LAB_00108911;
      uVar15 = uVar15 / 10000;
      uVar4 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_00108911:
  local_238 = local_228;
  std::__cxx11::string::_M_construct((ulong)&local_238,(char)uVar17 - (char)(y >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)y >> 0x1f) + (long)local_238),uVar17,uVar16);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    uVar10 = local_298.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_230 + local_298._M_string_length) {
    uVar15 = 0xf;
    if (local_238 != local_228) {
      uVar15 = local_228[0];
    }
    if (uVar15 < local_230 + local_298._M_string_length) goto LAB_00108989;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_238,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
  }
  else {
LAB_00108989:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_238);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  puVar13 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_278.field_2._M_allocated_capacity = *puVar13;
    local_278.field_2._8_8_ = puVar6[3];
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar13;
    local_278._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_278._M_string_length = puVar6[1];
  *puVar6 = puVar13;
  puVar6[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
  plVar14 = plVar5 + 2;
  if ((long *)*plVar5 == plVar14) {
    local_1a8 = *plVar14;
    lStack_1a0 = plVar5[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar14;
    local_1b8 = (long *)*plVar5;
  }
  local_1b0 = plVar5[1];
  *plVar5 = (long)plVar14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b8,(ulong)(pass->_M_dataplus)._M_p);
  plVar14 = plVar5 + 2;
  if ((long *)*plVar5 == plVar14) {
    local_208 = *plVar14;
    lStack_200 = plVar5[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar14;
    local_218 = (long *)*plVar5;
  }
  local_210 = plVar5[1];
  *plVar5 = (long)plVar14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  paVar2 = &local_278.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0]);
  }
  local_278._M_string_length = 0;
  local_278.field_2._M_allocated_capacity =
       local_278.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_278._M_dataplus._M_p = (pointer)paVar2;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_218,local_210 + (long)local_218);
  send_with_retry(this,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  lVar18 = -1;
  if ((this->closed != 0) || (read_with_retry(this,&local_278), this->closed != 0))
  goto LAB_00108d00;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&local_1b8,(string *)&local_278,_S_out|_S_in);
  local_298._M_string_length = 0;
  local_298.field_2._M_allocated_capacity =
       local_298.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_258._16_8_ = (pointer)0x0;
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  while (piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&local_1b8,(string *)&local_298,' '),
        ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
    if (local_298._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_258,&local_298);
    }
  }
  lVar8 = std::__cxx11::string::find((char *)local_258._0_8_,0x10b73a,0);
  local_2a0 = this;
  if (lVar8 == -1) {
LAB_00108ca6:
    local_2a0->closed = 1;
    lVar18 = -1;
  }
  else {
    __nptr = (((pointer)(local_258._0_8_ + 0x20))->_M_dataplus)._M_p;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    local_2a0 = (Net *)CONCAT44((int)((ulong)this >> 0x20),iVar3);
    *piVar9 = 0;
    lVar18 = strtoll(__nptr,local_1f8,10);
    if (local_1f8[0] == __nptr) {
      uVar10 = std::__throw_invalid_argument("stoll");
      if (*piVar9 == 0) {
        *piVar9 = iVar3;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if (local_218 != &local_208) {
        operator_delete(local_218);
      }
      _Unwind_Resume(uVar10);
    }
    if (*piVar9 == 0) {
      *piVar9 = iVar3;
    }
    else if (*piVar9 == 0x22) {
      std::__throw_out_of_range("stoll");
      goto LAB_00108ca6;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_00108d00:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  return lVar18;
}

Assistant:

long long Net::makeroom(int x,int y,std::string pass){
	std::string request="ROOM "+std::to_string(x)+" "+std::to_string(y)+" PASSWORD "+pass;
	std::string reply;
	send_with_retry(request);
	if(closed)return -1;
	read_with_retry(reply);
	if(closed)return -1;
	std::stringstream stream(reply);
	std::string temp;
	std::vector<std::string> replys;
	while(std::getline(stream,temp,' ')){
		if(!temp.empty()){
			replys.push_back(temp);
		}
	}
	if(replys[0].find("SUCCESS")!=std::string::npos){
		return std::stoll(replys[1]);
	}
	closed=1;
	return -1;
}